

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_slider.c
# Opt level: O2

void slider_bang(t_slider *x)

{
  t_pd *x_00;
  t_float f;
  
  if (pd_compatibilitylevel < 0x2e) {
    f = slider_getfval(x);
  }
  else {
    f = x->x_fval;
  }
  outlet_float((x->x_gui).x_obj.te_outlet,f);
  if ((((uint)(x->x_gui).x_fsf & 0x80) != 0) &&
     (x_00 = ((x->x_gui).x_snd)->s_thing, x_00 != (t_pd *)0x0)) {
    pd_float(x_00,f);
    return;
  }
  return;
}

Assistant:

static void slider_bang(t_slider *x)
{
    double out;

    if (pd_compatibilitylevel < 46)
        out = slider_getfval(x);
    else out = x->x_fval;
    outlet_float(x->x_gui.x_obj.ob_outlet, out);
    if(x->x_gui.x_fsf.x_snd_able && x->x_gui.x_snd->s_thing)
        pd_float(x->x_gui.x_snd->s_thing, out);
}